

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_packet.cc
# Opt level: O3

void __thiscall
QuickPacket::WriteData
          (QuickPacket *this,uint16_t sequence_number,uint8_t *data,uint16_t data_len,
          uint64_t sent_time)

{
  undefined6 in_register_0000000a;
  
  this->_sequence_number = sequence_number;
  if ((uint)CONCAT62(in_register_0000000a,data_len) < 0x579) {
    this->_data_len = data_len;
    memcpy((this->_data)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,data,(ulong)data_len);
    this->_pkt_sent_time = sent_time;
    return;
  }
  __assert_fail("data_len <= MAX_PKT_LEN",
                "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_packet.cc"
                ,0x16,"void QuickPacket::WriteData(uint16_t, uint8_t *, uint16_t, uint64_t)");
}

Assistant:

void QuickPacket::WriteData(uint16_t sequence_number, uint8_t* data, uint16_t data_len, uint64_t sent_time)
{
	_sequence_number = sequence_number;
	assert(data_len <= MAX_PKT_LEN);
	_data_len = data_len;
	memcpy(_data.get(), data, data_len);
	_pkt_sent_time = sent_time;
}